

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SAXParser.cpp
# Opt level: O0

void __thiscall xercesc_4_0::SAXParser::initialize(SAXParser *this)

{
  int iVar1;
  GrammarResolver *this_00;
  XMLStringPool *pXVar2;
  XMLScanner *pXVar3;
  undefined4 extraout_var;
  SAXParser *this_local;
  
  this_00 = (GrammarResolver *)XMemory::operator_new(0x50,this->fMemoryManager);
  GrammarResolver::GrammarResolver(this_00,this->fGrammarPool,this->fMemoryManager);
  this->fGrammarResolver = this_00;
  pXVar2 = GrammarResolver::getStringPool(this->fGrammarResolver);
  this->fURIStringPool = pXVar2;
  pXVar3 = XMLScannerResolver::getDefaultScanner
                     (this->fValidator,this->fGrammarResolver,this->fMemoryManager);
  this->fScanner = pXVar3;
  XMLScanner::setURIStringPool(this->fScanner,this->fURIStringPool);
  iVar1 = (*this->fMemoryManager->_vptr_MemoryManager[3])();
  this->fAdvDHList = (XMLDocumentHandler **)CONCAT44(extraout_var,iVar1);
  memset(this->fAdvDHList,0,this->fAdvDHListSize << 3);
  return;
}

Assistant:

void SAXParser::initialize()
{
    // Create grammar resolver and string pool to pass to scanner
    fGrammarResolver = new (fMemoryManager) GrammarResolver(fGrammarPool, fMemoryManager);
    fURIStringPool = fGrammarResolver->getStringPool();

    // Create our scanner and tell it what validator to use
    fScanner = XMLScannerResolver::getDefaultScanner(fValidator, fGrammarResolver, fMemoryManager);
    fScanner->setURIStringPool(fURIStringPool);

    // Create the initial advanced handler list array and zero it out
    fAdvDHList = (XMLDocumentHandler**) fMemoryManager->allocate
    (
        fAdvDHListSize * sizeof(XMLDocumentHandler*)
    );//new XMLDocumentHandler*[fAdvDHListSize];
    memset(fAdvDHList, 0, sizeof(void*) * fAdvDHListSize);
}